

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ublox.c
# Opt level: O2

slReturn ubxEnableNMEAMsg(int fdPort,int verbosity,nmeaMSG messageID,_Bool enable)

{
  ubxMsg msg;
  errInfo error;
  _Bool _Var1;
  slBuffer *buffer;
  slReturn pvVar2;
  ubxMsg nmeaMsg;
  errorInfo_slReturn local_40;
  
  buffer = create_slBuffer(8,LittleEndian);
  put_uint8_slBuffer(buffer,0,0xf0);
  put_uint8_slBuffer(buffer,1,(uint8_t)messageID);
  put_uint8_slBuffer(buffer,2,'\0');
  put_uint8_slBuffer(buffer,3,enable);
  put_uint8_slBuffer(buffer,4,'\0');
  put_uint8_slBuffer(buffer,5,'\0');
  put_uint8_slBuffer(buffer,6,'\0');
  put_uint8_slBuffer(buffer,7,'\0');
  createUbxMsg(&nmeaMsg,(ubxType)0x106,buffer);
  msg.body = nmeaMsg.body;
  msg.type = nmeaMsg.type;
  msg._2_6_ = nmeaMsg._2_6_;
  msg.checksum = nmeaMsg.checksum;
  msg._18_6_ = nmeaMsg._18_6_;
  pvVar2 = sendUbxAckedMsg(fdPort,msg);
  _Var1 = isErrorReturn(pvVar2);
  if (_Var1) {
    createErrorInfo(&local_40,
                    "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/ublox.c",
                    "ubxEnableNMEAMsg",0x197,pvVar2);
    error.fileName = local_40.fileName;
    error.cause = local_40.cause;
    error.functionName = local_40.functionName;
    error.lineNumber = local_40.lineNumber;
    error._28_4_ = local_40._28_4_;
    pvVar2 = makeErrorMsgReturn(error,"failed to enable /disable NMEA MSG");
    return pvVar2;
  }
  free(buffer);
  pvVar2 = makeOkReturn();
  return pvVar2;
}

Assistant:

extern slReturn ubxEnableNMEAMsg(int fdPort, int verbosity, nmeaMSG messageID, bool enable) {
    // construct the configuration message...
    slBuffer* body = create_slBuffer(8, LittleEndian);

    put_uint8_slBuffer(body,  0, 0xf0);             //  Message type NMEA
    put_uint8_slBuffer(body,  1, messageID);
    put_uint8_slBuffer(body,  2, 0x00);             //  other ports
    put_uint8_slBuffer(body,  3, (enable) ? 1 : 0); //  Serial port
    put_uint8_slBuffer(body,  4, 0x00);             //  other ports
    put_uint8_slBuffer(body,  5, 0x00);             //  other ports
    put_uint8_slBuffer(body,  6, 0x00);             //  other ports
    put_uint8_slBuffer(body,  7, 0x00);             //  other ports
    ubxMsg nmeaMsg = createUbxMsg(ut_CFG_MSG, body);

    // now send it, and wait for our ack...
    slReturn nmeaResp = sendUbxAckedMsg(fdPort, nmeaMsg);
    if (isErrorReturn(nmeaResp))
        return makeErrorMsgReturn(ERR_CAUSE(nmeaResp), "failed to enable /disable NMEA MSG");

    free(body);

    return makeOkReturn();
}